

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

void entry_list_free(entry_list *list)

{
  void *pvVar1;
  undefined8 *in_RDI;
  match_file *q;
  match_file *p;
  undefined8 local_10;
  
  local_10 = (void *)*in_RDI;
  while (local_10 != (void *)0x0) {
    pvVar1 = *(void **)((long)local_10 + 0x18);
    archive_mstring_clean((archive_mstring *)0x11b5a2);
    free(local_10);
    local_10 = pvVar1;
  }
  return;
}

Assistant:

static void
entry_list_free(struct entry_list *list)
{
	struct match_file *p, *q;

	for (p = list->first; p != NULL; ) {
		q = p;
		p = p->next;
		archive_mstring_clean(&(q->pathname));
		free(q);
	}
}